

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
IRT::CJumpConditionalStatement::CJumpConditionalStatement
          (CJumpConditionalStatement *this,TLogicOperator _operation,
          unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *left,
          unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *right,
          unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
          *_labelTrue,
          unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
          *_labelFalse)

{
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
  *_labelFalse_local;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
  *_labelTrue_local;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *right_local;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *left_local;
  TLogicOperator _operation_local;
  CJumpConditionalStatement *this_local;
  
  CStatement::CStatement(&this->super_CStatement);
  (this->super_CStatement).super_IStatement.super_INode._vptr_INode =
       (_func_int **)&PTR_Accept_00237e88;
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&this->leftOperand,left);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&this->rightOperand,right);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr(&this->labelTrue,_labelTrue);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr(&this->labelFalse,_labelFalse);
  this->operation = _operation;
  return;
}

Assistant:

CJumpConditionalStatement::CJumpConditionalStatement( TLogicOperator _operation,
                                                      std::unique_ptr<const CExpression> left,
                                                      std::unique_ptr<const CExpression> right,
                                                      std::unique_ptr<const CLabelStatement> _labelTrue,
                                                      std::unique_ptr<const CLabelStatement> _labelFalse )
        : operation( _operation ),
          leftOperand( std::move( left )), rightOperand( std::move( right )),
          labelTrue( std::move( _labelTrue )), labelFalse( std::move( _labelFalse )) { }